

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

PipelineFor<DynamicCapability> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicCapability> *__return_storage_ptr__,Pipeline *pipeline)

{
  bool bVar1;
  Client *pCVar2;
  Fault local_58;
  Fault f;
  Type *local_48;
  undefined1 local_40 [8];
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Pipeline *pipeline_local;
  
  _kjCondition._32_8_ = pipeline;
  local_48 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pipeline->type);
  f.exception._4_4_ = 0xb;
  kj::_::DebugExpression<capnp::DynamicValue::Type&>::operator==
            ((DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
             (DebugExpression<capnp::DynamicValue::Type&> *)&local_48,
             (Type *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar1) {
    pCVar2 = kj::mv<capnp::DynamicCapability::Client>((Client *)(_kjCondition._32_8_ + 8));
    DynamicCapability::Client::Client(__return_storage_ptr__,pCVar2);
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[24]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x740,FAILED,"pipeline.type == CAPABILITY",
               "_kjCondition,\"Pipeline type mismatch.\"",
               (DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
               (char (*) [24])"Pipeline type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x0;
    DynamicCapability::Client::Client(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineFor<DynamicCapability> DynamicValue::Pipeline::AsImpl<DynamicCapability>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == CAPABILITY, "Pipeline type mismatch.") {
    return DynamicCapability::Client();
  }
  return kj::mv(pipeline.capabilityValue);
}